

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters_sse2.c
# Opt level: O2

void VerticalFilter_SSE2(uint8_t *data,int width,int height,int stride,uint8_t *filtered_data)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  uint8_t *puVar3;
  uint8_t *puVar4;
  uint8_t uVar5;
  uint8_t uVar6;
  uint8_t uVar7;
  uint8_t uVar8;
  uint8_t uVar9;
  uint8_t uVar10;
  uint8_t uVar11;
  uint8_t uVar12;
  uint8_t uVar13;
  uint8_t uVar14;
  uint8_t uVar15;
  uint8_t uVar16;
  uint8_t uVar17;
  uint8_t uVar18;
  uint8_t uVar19;
  uint8_t uVar20;
  uint8_t uVar21;
  uint8_t uVar22;
  uint8_t uVar23;
  uint8_t uVar24;
  uint8_t uVar25;
  uint8_t uVar26;
  uint8_t uVar27;
  uint8_t uVar28;
  uint8_t uVar29;
  uint8_t uVar30;
  uint8_t uVar31;
  uint8_t uVar32;
  uint8_t uVar33;
  uint8_t uVar34;
  uint8_t uVar35;
  uint8_t uVar36;
  uint8_t uVar37;
  uint8_t uVar38;
  uint8_t uVar39;
  uint8_t uVar40;
  uint8_t uVar41;
  uint8_t uVar42;
  uint8_t uVar43;
  uint8_t uVar44;
  uint8_t uVar45;
  uint8_t uVar46;
  uint8_t uVar47;
  uint8_t uVar48;
  uint8_t uVar49;
  uint8_t uVar50;
  uint8_t uVar51;
  uint8_t uVar52;
  uint8_t uVar53;
  uint8_t uVar54;
  uint8_t uVar55;
  uint8_t uVar56;
  uint8_t uVar57;
  uint8_t uVar58;
  uint8_t uVar59;
  uint8_t uVar60;
  uint8_t uVar61;
  uint8_t uVar62;
  uint8_t uVar63;
  uint8_t uVar64;
  uint8_t uVar65;
  uint8_t uVar66;
  long lVar67;
  uint8_t *puVar68;
  int iVar69;
  long lVar70;
  long lVar71;
  uint8_t *puVar72;
  int i;
  long lVar73;
  
  *filtered_data = *data;
  PredictLineLeft_SSE2(data + 1,filtered_data + 1,width + -1);
  lVar67 = (long)stride;
  lVar70 = 0;
  puVar68 = filtered_data;
  puVar72 = data;
  for (iVar69 = 1; iVar69 < height; iVar69 = iVar69 + 1) {
    puVar68 = puVar68 + lVar67;
    puVar1 = puVar72 + lVar67;
    lVar71 = lVar70;
    for (lVar73 = 0; lVar73 < (int)(width & 0xffffffe0); lVar73 = lVar73 + 0x20) {
      puVar2 = puVar1 + lVar73;
      uVar5 = puVar2[1];
      uVar6 = puVar2[2];
      uVar7 = puVar2[3];
      uVar8 = puVar2[4];
      uVar9 = puVar2[5];
      uVar10 = puVar2[6];
      uVar11 = puVar2[7];
      uVar12 = puVar2[8];
      uVar13 = puVar2[9];
      uVar14 = puVar2[10];
      uVar15 = puVar2[0xb];
      uVar16 = puVar2[0xc];
      uVar17 = puVar2[0xd];
      uVar18 = puVar2[0xe];
      uVar19 = puVar2[0xf];
      puVar3 = puVar1 + lVar73 + 0x10;
      uVar20 = *puVar3;
      uVar21 = puVar3[1];
      uVar22 = puVar3[2];
      uVar23 = puVar3[3];
      uVar24 = puVar3[4];
      uVar25 = puVar3[5];
      uVar26 = puVar3[6];
      uVar27 = puVar3[7];
      uVar28 = puVar3[8];
      uVar29 = puVar3[9];
      uVar30 = puVar3[10];
      uVar31 = puVar3[0xb];
      uVar32 = puVar3[0xc];
      uVar33 = puVar3[0xd];
      uVar34 = puVar3[0xe];
      uVar35 = puVar3[0xf];
      puVar3 = puVar72 + lVar73;
      uVar36 = puVar3[1];
      uVar37 = puVar3[2];
      uVar38 = puVar3[3];
      uVar39 = puVar3[4];
      uVar40 = puVar3[5];
      uVar41 = puVar3[6];
      uVar42 = puVar3[7];
      uVar43 = puVar3[8];
      uVar44 = puVar3[9];
      uVar45 = puVar3[10];
      uVar46 = puVar3[0xb];
      uVar47 = puVar3[0xc];
      uVar48 = puVar3[0xd];
      uVar49 = puVar3[0xe];
      uVar50 = puVar3[0xf];
      puVar4 = puVar72 + lVar73 + 0x10;
      uVar51 = *puVar4;
      uVar52 = puVar4[1];
      uVar53 = puVar4[2];
      uVar54 = puVar4[3];
      uVar55 = puVar4[4];
      uVar56 = puVar4[5];
      uVar57 = puVar4[6];
      uVar58 = puVar4[7];
      uVar59 = puVar4[8];
      uVar60 = puVar4[9];
      uVar61 = puVar4[10];
      uVar62 = puVar4[0xb];
      uVar63 = puVar4[0xc];
      uVar64 = puVar4[0xd];
      uVar65 = puVar4[0xe];
      uVar66 = puVar4[0xf];
      puVar4 = puVar68 + lVar73;
      *puVar4 = *puVar2 - *puVar3;
      puVar4[1] = uVar5 - uVar36;
      puVar4[2] = uVar6 - uVar37;
      puVar4[3] = uVar7 - uVar38;
      puVar4[4] = uVar8 - uVar39;
      puVar4[5] = uVar9 - uVar40;
      puVar4[6] = uVar10 - uVar41;
      puVar4[7] = uVar11 - uVar42;
      puVar4[8] = uVar12 - uVar43;
      puVar4[9] = uVar13 - uVar44;
      puVar4[10] = uVar14 - uVar45;
      puVar4[0xb] = uVar15 - uVar46;
      puVar4[0xc] = uVar16 - uVar47;
      puVar4[0xd] = uVar17 - uVar48;
      puVar4[0xe] = uVar18 - uVar49;
      puVar4[0xf] = uVar19 - uVar50;
      puVar2 = puVar68 + lVar73 + 0x10;
      *puVar2 = uVar20 - uVar51;
      puVar2[1] = uVar21 - uVar52;
      puVar2[2] = uVar22 - uVar53;
      puVar2[3] = uVar23 - uVar54;
      puVar2[4] = uVar24 - uVar55;
      puVar2[5] = uVar25 - uVar56;
      puVar2[6] = uVar26 - uVar57;
      puVar2[7] = uVar27 - uVar58;
      puVar2[8] = uVar28 - uVar59;
      puVar2[9] = uVar29 - uVar60;
      puVar2[10] = uVar30 - uVar61;
      puVar2[0xb] = uVar31 - uVar62;
      puVar2[0xc] = uVar32 - uVar63;
      puVar2[0xd] = uVar33 - uVar64;
      puVar2[0xe] = uVar34 - uVar65;
      puVar2[0xf] = uVar35 - uVar66;
      lVar71 = lVar71 + 0x20;
    }
    for (; lVar73 < width; lVar73 = lVar73 + 1) {
      filtered_data[lVar71 + lVar67] = data[lVar71 + lVar67] - data[lVar71];
      lVar71 = lVar71 + 1;
    }
    lVar70 = lVar70 + lVar67;
    puVar72 = puVar1;
  }
  return;
}

Assistant:

static void VerticalFilter_SSE2(const uint8_t* WEBP_RESTRICT data,
                                int width, int height, int stride,
                                uint8_t* WEBP_RESTRICT filtered_data) {
  DoVerticalFilter_SSE2(data, width, height, stride, filtered_data);
}